

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O2

void __thiscall MODEL3D::three_dim_model::python_script_conclude(three_dim_model *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    My_doc.recompute()",(allocator<char> *)&local_38);
  this_00 = &this->py_script;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    time_end = time.perf_counter() - time_start",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    fmt = format(time_end, \'.2f\')",(allocator<char> *)&local_38
            );
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&bStack_58,"    print(f\'Layer generation took \'+fmt+\' seconds.\')",
             (allocator<char> *)&local_38);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::operator+(&local_38,"    My_doc.saveAs(u\"",&this->cell_name);
  std::operator+(&bStack_58,&local_38,".FCStd\")");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_00,&bStack_58
            );
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MODEL3D::three_dim_model::python_script_conclude()
{
    py_script.push_back("    My_doc.recompute()");
    py_script.push_back("    time_end = time.perf_counter() - time_start");
    py_script.push_back("    fmt = format(time_end, '.2f')");
    py_script.push_back("    print(f'Layer generation took '+fmt+' seconds.')");
    py_script.push_back("    My_doc.saveAs(u\""+cell_name+".FCStd\")");
}